

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_int,_int,_int,_int,_int,_int,_int,_int,_char[14]>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,int,int,int,int,int,int,int,int,char_const[14]>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_int,_int,_int,_int,_int,_int,_int,_int,_char[14]>
           *__return_storage_ptr__,v10 *this,uint *args,int *args_1,int *args_2,int *args_3,
          int *args_4,int *args_5,int *args_6,int *args_7,int *args_8,char (*args_9) [14])

{
  bool formattable_8;
  bool formattable_pointer_8;
  bool formattable_char_8;
  bool formattable_7;
  bool formattable_pointer_7;
  bool formattable_char_7;
  bool formattable_6;
  bool formattable_pointer_6;
  bool formattable_char_6;
  bool formattable_5;
  bool formattable_pointer_5;
  bool formattable_char_5;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_char_4;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_char_3;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_9;
  bool formattable_pointer_9;
  bool formattable_char_9;
  longlong local_2e8;
  size_t local_2e0;
  longlong local_2a8;
  size_t local_2a0;
  longlong local_268;
  size_t local_260;
  longlong local_228;
  size_t local_220;
  longlong local_1e8;
  size_t local_1e0;
  longlong local_1a8;
  size_t local_1a0;
  longlong local_168;
  size_t local_160;
  longlong local_128;
  size_t local_120;
  longlong local_e8;
  size_t local_e0;
  int *args_local_4;
  int *args_local_3;
  int *args_local_2;
  int *args_local_1;
  uint *args_local;
  size_t local_40;
  
  local_e8._0_4_ = *(undefined4 *)this;
  local_128._0_4_ = *args;
  local_168._0_4_ = *args_1;
  local_1a8._0_4_ = *args_2;
  local_1e8._0_4_ = *args_3;
  local_228._0_4_ = *args_4;
  local_268._0_4_ = *args_5;
  local_2a8._0_4_ = *args_6;
  local_2e8._0_4_ = *args_7;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_e8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_e0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_128;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_120;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_168;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_160;
  (__return_storage_ptr__->data_).args_[3].field_0.long_long_value = local_1a8;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_1a0;
  (__return_storage_ptr__->data_).args_[4].field_0.long_long_value = local_1e8;
  (__return_storage_ptr__->data_).args_[4].field_0.string.size = local_1e0;
  (__return_storage_ptr__->data_).args_[5].field_0.long_long_value = local_228;
  (__return_storage_ptr__->data_).args_[5].field_0.string.size = local_220;
  (__return_storage_ptr__->data_).args_[6].field_0.long_long_value = local_268;
  (__return_storage_ptr__->data_).args_[6].field_0.string.size = local_260;
  (__return_storage_ptr__->data_).args_[7].field_0.long_long_value = local_2a8;
  (__return_storage_ptr__->data_).args_[7].field_0.string.size = local_2a0;
  (__return_storage_ptr__->data_).args_[8].field_0.long_long_value = local_2e8;
  (__return_storage_ptr__->data_).args_[8].field_0.string.size = local_2e0;
  (__return_storage_ptr__->data_).args_[9].field_0.string.data = (char *)args_8;
  (__return_storage_ptr__->data_).args_[9].field_0.string.size = local_40;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}